

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::removeMember(Value *this,char *key)

{
  char *in_RDX;
  long in_RSI;
  Value *in_RDI;
  ostringstream oss;
  Value *removed;
  undefined8 in_stack_fffffffffffffe18;
  ostringstream local_190 [24];
  Value *in_stack_fffffffffffffe88;
  Value *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  Value *in_stack_fffffffffffffea8;
  
  if (((*(ushort *)(in_RSI + 8) & 0xff) != 0) && ((*(ushort *)(in_RSI + 8) & 0xff) != 7)) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,"in Json::Value::removeMember(): requires objectValue");
    std::__cxx11::ostringstream::str();
    throwLogicError((string *)in_RDI);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
    abort();
  }
  if ((*(ushort *)(in_RSI + 8) & 0xff) == 0) {
    Value(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  else {
    Value(in_RDI,(ValueType)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    strlen(in_RDX);
    removeMember(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 in_stack_fffffffffffffe90);
  }
  return in_RDI;
}

Assistant:

Value Value::removeMember(const char* key)
{
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == objectValue,
                      "in Json::Value::removeMember(): requires objectValue");
  if (type_ == nullValue)
    return nullRef;

  Value removed;  // null
  removeMember(key, key + strlen(key), &removed);
  return removed; // still null if removeMember() did nothing
}